

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O2

bool ReadDFI(MemFile *file,shared_ptr<Disk> *disk)

{
  char extraout_AL;
  bool bVar1;
  ssize_t sVar2;
  exception *peVar3;
  ushort uVar4;
  size_t in_RCX;
  DFI_FILE_HEADER fh;
  allocator_type local_73;
  DFI_TRACK_HEADER th;
  shared_ptr<DFIDisk> dfi_disk;
  CylHead cylhead;
  Data track_data;
  
  fh.signature[0] = '\0';
  fh.signature[1] = '\0';
  fh.signature[2] = '\0';
  fh.signature[3] = '\0';
  MemFile::rewind(file,(FILE *)disk);
  if ((extraout_AL != '\0') &&
     (sVar2 = MemFile::read(file,(int)&fh,(void *)0x4,in_RCX), (char)sVar2 != '\0')) {
    if (fh.signature == (char  [4])0x52454644) {
      peVar3 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[46]>
                (peVar3,(char (*) [46])"old-style DiscFerret images are not supported");
      __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if (fh.signature == (char  [4])0x32454644) {
      std::make_shared<DFIDisk>();
      while( true ) {
        sVar2 = MemFile::read(file,(int)&th,(void *)0xa,in_RCX);
        if ((char)sVar2 == '\0') {
          std::__cxx11::string::assign
                    ((char *)&((dfi_disk.super___shared_ptr<DFIDisk,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_DemandDisk).super_Disk.strType);
          std::__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2> *)disk,
                     &dfi_disk.super___shared_ptr<DFIDisk,_(__gnu_cxx::_Lock_policy)2>);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&dfi_disk.super___shared_ptr<DFIDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return true;
        }
        if (th.sector != 0x100) break;
        uVar4 = th.head << 8 | th.head >> 8;
        in_RCX = (size_t)uVar4;
        CylHead::CylHead(&cylhead,(uint)(ushort)(th.cyl << 8 | th.cyl >> 8),(uint)uVar4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&track_data,
                   (ulong)((uint)th.datalen >> 0x18 | ((uint)th.datalen & 0xff0000) >> 8 |
                           ((uint)th.datalen & 0xff00) << 8 | (int)th.datalen << 0x18),&local_73);
        bVar1 = MemFile::read<Data>(file,&track_data);
        if (!bVar1) {
          peVar3 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[6]>
                    (peVar3,(char (*) [20])"short file reading ",&cylhead,(char (*) [6])0x1aeb6e);
          __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        DFIDisk::add_track_data
                  (dfi_disk.super___shared_ptr<DFIDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&cylhead,
                   &track_data);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&track_data);
      }
      peVar3 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[39]>
                (peVar3,(char (*) [39])"hard-sectored images are not supported");
      __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return false;
}

Assistant:

bool ReadDFI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DFI_FILE_HEADER fh{};

    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;

    if (!memcmp(fh.signature, "DFER", sizeof(fh.signature)))
        throw util::exception("old-style DiscFerret images are not supported");
    else if (memcmp(fh.signature, "DFE2", sizeof(fh.signature)))
        return false;

    auto dfi_disk = std::make_shared<DFIDisk>();

    for (;;)
    {
        DFI_TRACK_HEADER th;
        if (!file.read(&th, sizeof(th)))
            break;

        if (util::betoh(th.sector) != 1)
            throw util::exception("hard-sectored images are not supported");

        CylHead cylhead(util::betoh(th.cyl), util::betoh(th.head));
        auto data_length = (static_cast<uint32_t>(th.datalen[0]) << 24) | (th.datalen[1] << 16) | (th.datalen[2] << 8) | th.datalen[3];

        Data track_data(data_length);
        if (!file.read(track_data))
            throw util::exception("short file reading ", cylhead, " data");

        dfi_disk->add_track_data(cylhead, std::move(track_data));
    }

    dfi_disk->strType = "DFI";
    disk = dfi_disk;

    return true;
}